

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

Cluster * mkvparser::Cluster::Create(Segment *pSegment,long idx,longlong off)

{
  long lVar1;
  Cluster *this;
  long in_RDX;
  long in_RSI;
  Segment *in_RDI;
  Cluster *pCluster;
  longlong element_start;
  Cluster *local_58;
  Cluster *local_8;
  
  if ((in_RDI == (Segment *)0x0) || (in_RDX < 0)) {
    local_8 = (Cluster *)0x0;
  }
  else {
    lVar1 = in_RDI->m_start;
    this = (Cluster *)operator_new(0x48,(nothrow_t *)&std::nothrow);
    local_58 = (Cluster *)0x0;
    if (this != (Cluster *)0x0) {
      Cluster(this,in_RDI,in_RSI,lVar1 + in_RDX);
      local_58 = this;
    }
    local_8 = local_58;
  }
  return local_8;
}

Assistant:

Cluster* Cluster::Create(Segment* pSegment, long idx, long long off) {
  if (!pSegment || off < 0)
    return NULL;

  const long long element_start = pSegment->m_start + off;

  Cluster* const pCluster =
      new (std::nothrow) Cluster(pSegment, idx, element_start);

  return pCluster;
}